

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O0

void __thiscall serialization::xml_iarchive::load_key_start(xml_iarchive *this,char *key)

{
  reference ppxVar1;
  xml_node<char> *local_28;
  xml_node<char> *node;
  char *pcStack_18;
  serialization_trace trace;
  char *key_local;
  xml_iarchive *this_local;
  
  pcStack_18 = key;
  serialization_trace::serialization_trace<char_const(&)[15],char_const*&>
            ((serialization_trace *)((long)&node + 7),(char (*) [15])"load_key_start",
             &stack0xffffffffffffffe8);
  ppxVar1 = std::
            stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
            ::top(&this->stack_);
  local_28 = rapidxml::xml_node<char>::first_node(*ppxVar1,pcStack_18,0,true);
  if (local_28 == (xml_node<char> *)0x0) {
    throw_serialization_error("expect key",pcStack_18);
  }
  std::
  stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
  ::push(&this->stack_,&local_28);
  return;
}

Assistant:

void load_key_start(const char * key) const
    {
        serialization_trace trace(__func__, key);

        auto node = stack_.top()->first_node(key);
        if(node == nullptr)
            throw_serialization_error("expect key", key);
        stack_.push(node);
    }